

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O2

CommandSignature __thiscall llbuild::buildsystem::BuildNode::getSignature(BuildNode *this)

{
  pointer ppCVar1;
  StringRef string;
  pointer ppCVar2;
  CommandSignature sig;
  CommandSignature local_20;
  
  local_20.value = 0;
  llbuild::basic::CommandSignature::combine(&local_20,this->type != Plain);
  ppCVar1 = (this->super_Node).producers.
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->super_Node).producers.
                 super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar2 != ppCVar1;
      ppCVar2 = ppCVar2 + 1) {
    string.Data = ((*ppCVar2)->name)._M_dataplus._M_p;
    string.Length = ((*ppCVar2)->name)._M_string_length;
    llbuild::basic::CommandSignature::combine(&local_20,string);
  }
  return (CommandSignature)local_20.value;
}

Assistant:

basic::CommandSignature BuildNode::getSignature() const {
  basic::CommandSignature sig;
  sig.combine(static_cast<unsigned int>(type));
  // We include the name of all producer rules in the signature to ensure that
  // we properly pick up changes in build graph structure.  For example, a node
  // that was previously a plain input that has changed to become a produced
  // node.
  for (auto* producer : getProducers()) {
    sig.combine(producer->getName());
  }
  return sig;
}